

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

void Gia_ManSimplifyAnd(Vec_Int_t *vSuper)

{
  int Lit;
  int iVar1;
  int iVar2;
  int i;
  int Lit_00;
  int nSizeNew;
  
  Lit_00 = -1;
  nSizeNew = 0;
  i = 0;
  do {
    if (vSuper->nSize <= i) {
      Vec_IntShrink(vSuper,nSizeNew);
      if (vSuper->nSize == 0) {
        Vec_IntPush(vSuper,1);
        return;
      }
      return;
    }
    Lit = Vec_IntEntry(vSuper,i);
    if (Lit != 1) {
      if (Lit == 0) {
LAB_005cf62b:
        Vec_IntFill(vSuper,1,0);
        return;
      }
      if (Lit_00 != -1) {
        iVar1 = Abc_Lit2Var(Lit_00);
        iVar2 = Abc_Lit2Var(Lit);
        if (iVar1 == iVar2) {
          if (Lit_00 != Lit) goto LAB_005cf62b;
          goto LAB_005cf604;
        }
      }
      Vec_IntWriteEntry(vSuper,nSizeNew,Lit);
      Lit_00 = Lit;
      nSizeNew = nSizeNew + 1;
    }
LAB_005cf604:
    i = i + 1;
  } while( true );
}

Assistant:

void Gia_ManSimplifyAnd( Vec_Int_t * vSuper )
{
    int i, k = 0, Prev = -1, This;
    Vec_IntForEachEntry( vSuper, This, i )
    {
        if ( This == 0 )
            { Vec_IntFill(vSuper, 1, 0); return; }
        if ( This == 1 )
            continue;
        if ( Prev == -1 || Abc_Lit2Var(Prev) != Abc_Lit2Var(This) )
            Vec_IntWriteEntry( vSuper, k++, This ), Prev = This;
        else if ( Prev != This )
            { Vec_IntFill(vSuper, 1, 0); return; }
    }
    Vec_IntShrink( vSuper, k );
    if ( Vec_IntSize( vSuper ) == 0 )
        Vec_IntPush( vSuper, 1 );
}